

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UCIAdapter.cpp
# Opt level: O1

void __thiscall senjo::UCIAdapter::HelpCommand(UCIAdapter *this,char *param_1)

{
  Output local_70;
  long local_68;
  _func_int *local_60 [2];
  Output local_50;
  char local_48;
  undefined7 uStack_47;
  long local_40;
  long local_38 [2];
  long *local_28;
  long local_20;
  long local_18 [2];
  
  Output::Output(&local_50,InfoPrefix);
  (**this->engine->_vptr_ChessEngine)(&local_70);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,(char *)local_70._vptr_Output,local_68);
  local_48 = ' ';
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,&local_48,1);
  (*this->engine->_vptr_ChessEngine[1])(&local_48);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,(char *)CONCAT71(uStack_47,local_48),local_40);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," by ",4);
  (*this->engine->_vptr_ChessEngine[2])(&local_28);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,(char *)local_28,local_20);
  if (local_28 != local_18) {
    operator_delete(local_28,local_18[0] + 1);
  }
  if ((long *)CONCAT71(uStack_47,local_48) != local_38) {
    operator_delete((long *)CONCAT71(uStack_47,local_48),local_38[0] + 1);
  }
  if (local_70._vptr_Output != local_60) {
    operator_delete(local_70._vptr_Output,(ulong)(local_60[0] + 1));
  }
  Output::~Output(&local_50);
  Output::Output(&local_70,InfoPrefix);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"UCI commands:",0xd);
  Output::~Output(&local_70);
  Output::Output(&local_70,InfoPrefix);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"  ",2);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,token::Debug_abi_cxx11_,DAT_001b6708);
  Output::~Output(&local_70);
  Output::Output(&local_70,InfoPrefix);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"  ",2);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,token::Go_abi_cxx11_,DAT_001b6768);
  Output::~Output(&local_70);
  Output::Output(&local_70,InfoPrefix);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"  ",2);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,token::IsReady_abi_cxx11_,DAT_001b67a8);
  Output::~Output(&local_70);
  Output::Output(&local_70,InfoPrefix);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"  ",2);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,token::Position_abi_cxx11_,DAT_001b6888);
  Output::~Output(&local_70);
  Output::Output(&local_70,InfoPrefix);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"  ",2);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,token::Quit_abi_cxx11_,DAT_001b68c8);
  Output::~Output(&local_70);
  Output::Output(&local_70,InfoPrefix);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"  ",2);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,token::SetOption_abi_cxx11_,DAT_001b6908);
  Output::~Output(&local_70);
  Output::Output(&local_70,InfoPrefix);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"  ",2);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,token::Stop_abi_cxx11_,DAT_001b6948);
  Output::~Output(&local_70);
  Output::Output(&local_70,InfoPrefix);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"  ",2);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,token::Uci_abi_cxx11_,DAT_001b6988);
  Output::~Output(&local_70);
  Output::Output(&local_70,InfoPrefix);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"  ",2);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,token::UciNewGame_abi_cxx11_,DAT_001b69a8);
  Output::~Output(&local_70);
  Output::Output(&local_70,InfoPrefix);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Additional commands:",0x14);
  Output::~Output(&local_70);
  Output::Output(&local_70,InfoPrefix);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"  ",2);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,token::Exit_abi_cxx11_,DAT_001b6728);
  Output::~Output(&local_70);
  Output::Output(&local_70,InfoPrefix);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"  ",2);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,token::Fen_abi_cxx11_,DAT_001b6748);
  Output::~Output(&local_70);
  Output::Output(&local_70,InfoPrefix);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"  ",2);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,token::Help_abi_cxx11_,DAT_001b6788);
  Output::~Output(&local_70);
  Output::Output(&local_70,InfoPrefix);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"  ",2);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,token::New_abi_cxx11_,DAT_001b6808);
  Output::~Output(&local_70);
  Output::Output(&local_70,InfoPrefix);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"  ",2);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,token::Perft_abi_cxx11_,DAT_001b6848);
  Output::~Output(&local_70);
  Output::Output(&local_70,InfoPrefix);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"  ",2);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,token::Print_abi_cxx11_,DAT_001b68a8);
  Output::~Output(&local_70);
  Output::Output(&local_70,InfoPrefix);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"  ",2);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,token::Test_abi_cxx11_,DAT_001b6968);
  Output::~Output(&local_70);
  Output::Output(&local_70,InfoPrefix);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Also try \'<command> help\' for help on a specific command",0x38
            );
  Output::~Output(&local_70);
  Output::Output(&local_70,InfoPrefix);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Or enter move(s) in coordinate notation, e.g. d2d4 g8f6",0x37);
  Output::~Output(&local_70);
  return;
}

Assistant:

void UCIAdapter::HelpCommand(const char* /*params*/)
{
  Output() << engine->GetEngineName() << ' ' << engine->GetEngineVersion()
           << " by " << engine->GetAuthorName();
  Output() << "UCI commands:";
  Output() << "  " << token::Debug;
  Output() << "  " << token::Go;
  Output() << "  " << token::IsReady;
  Output() << "  " << token::Position;
  Output() << "  " << token::Quit;
  Output() << "  " << token::SetOption;
  Output() << "  " << token::Stop;
  Output() << "  " << token::Uci;
  Output() << "  " << token::UciNewGame;
  Output() << "Additional commands:";
  Output() << "  " << token::Exit;
  Output() << "  " << token::Fen;
  Output() << "  " << token::Help;
  Output() << "  " << token::New;
  Output() << "  " << token::Perft;
  Output() << "  " << token::Print;
  Output() << "  " << token::Test;
  Output() << "Also try '<command> help' for help on a specific command";
  Output() << "Or enter move(s) in coordinate notation, e.g. d2d4 g8f6";
}